

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O3

void __thiscall Shell::FunctionDefinition::assignArgOccursData(FunctionDefinition *this,Def *updDef)

{
  TermList **ppTVar1;
  int iVar2;
  bool *pbVar3;
  Entry *pEVar4;
  Entry *pEVar5;
  anon_union_8_2_f154dc0f_for_Term_10 aVar6;
  uint uVar7;
  Def *pDVar8;
  Term *trm;
  anon_union_8_2_f154dc0f_for_Term_10 *paVar9;
  Term *pTVar10;
  ulong uVar11;
  TermList *pTVar12;
  TermList *pTVar13;
  uint local_40;
  uint local_3c;
  FunctionDefinition *local_38;
  
  uVar7 = *(uint *)&updDef->lhs->field_0xc;
  if ((uVar7 & 0xfffffff) == 0) {
    return;
  }
  uVar7 = (uVar7 & 0xfffffff) + 0xf & 0xfffffff0;
  local_38 = this;
  if (uVar7 == 0) {
    pbVar3 = (bool *)Lib::FixedSizeAllocator<8UL>::alloc
                               ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar7 < 0x11) {
    pbVar3 = (bool *)Lib::FixedSizeAllocator<16UL>::alloc
                               ((FixedSizeAllocator<16UL> *)
                                (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar7 < 0x19) {
    pbVar3 = (bool *)Lib::FixedSizeAllocator<24UL>::alloc
                               ((FixedSizeAllocator<24UL> *)
                                (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar7 < 0x21) {
    pbVar3 = (bool *)Lib::FixedSizeAllocator<32UL>::alloc
                               ((FixedSizeAllocator<32UL> *)
                                (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar7 < 0x31) {
    pbVar3 = (bool *)Lib::FixedSizeAllocator<48UL>::alloc
                               ((FixedSizeAllocator<48UL> *)
                                (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar7 < 0x41) {
    pbVar3 = (bool *)Lib::FixedSizeAllocator<64UL>::alloc
                               ((FixedSizeAllocator<64UL> *)
                                (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pbVar3 = (bool *)::operator_new((ulong)uVar7,0x10);
  }
  updDef->argOccurs = pbVar3;
  memset(pbVar3,0,(ulong)(*(uint *)&updDef->lhs->field_0xc & 0xfffffff));
  if (assignArgOccursData(Shell::FunctionDefinition::Def*)::var2argIndex == '\0') {
    assignArgOccursData();
  }
  Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::reset
            (&assignArgOccursData::var2argIndex);
  pTVar10 = updDef->lhs;
  uVar7 = *(uint *)&pTVar10->field_0xc & 0xfffffff;
  aVar6 = *(anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar10->_args + uVar7);
  if ((aVar6._vars & 3) != 2) {
    paVar9 = (anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar10->_args + ((ulong)uVar7 - 1));
    uVar7 = 0;
    do {
      Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::insert
                (&assignArgOccursData::var2argIndex,(uint)((ulong)aVar6 >> 2),uVar7);
      uVar7 = uVar7 + 1;
      aVar6 = *paVar9;
      paVar9 = paVar9 + -1;
    } while ((aVar6._vars & 3) != 2);
  }
  pTVar10 = updDef->rhs;
  if ((assignArgOccursData(Shell::FunctionDefinition::Def*)::stack == '\0') &&
     (iVar2 = __cxa_guard_acquire(&assignArgOccursData(Shell::FunctionDefinition::Def*)::stack),
     iVar2 != 0)) {
    assignArgOccursData::stack._capacity = 4;
    assignArgOccursData::stack._stack =
         (TermList **)
         Lib::FixedSizeAllocator<32UL>::alloc
                   ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
    assignArgOccursData::stack._end =
         assignArgOccursData::stack._stack + assignArgOccursData::stack._capacity;
    assignArgOccursData::stack._cursor = assignArgOccursData::stack._stack;
    __cxa_atexit(Lib::Stack<Kernel::TermList_*>::~Stack,&assignArgOccursData::stack,&__dso_handle);
    __cxa_guard_release(&assignArgOccursData(Shell::FunctionDefinition::Def*)::stack);
  }
  if ((assignArgOccursData(Shell::FunctionDefinition::Def*)::defArgStack == '\0') &&
     (iVar2 = __cxa_guard_acquire(&assignArgOccursData(Shell::FunctionDefinition::Def*)::defArgStack
                                 ), iVar2 != 0)) {
    assignArgOccursData::defArgStack._capacity = 4;
    assignArgOccursData::defArgStack._stack =
         (Def **)Lib::FixedSizeAllocator<32UL>::alloc
                           ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48))
    ;
    assignArgOccursData::defArgStack._end =
         assignArgOccursData::defArgStack._stack + assignArgOccursData::defArgStack._capacity;
    assignArgOccursData::defArgStack._cursor = assignArgOccursData::defArgStack._stack;
    __cxa_atexit(Lib::Stack<Shell::FunctionDefinition::Def_*>::~Stack,
                 &assignArgOccursData::defArgStack,&__dso_handle);
    __cxa_guard_release(&assignArgOccursData(Shell::FunctionDefinition::Def*)::defArgStack);
  }
  if ((assignArgOccursData(Shell::FunctionDefinition::Def*)::termArgStack == '\0') &&
     (iVar2 = __cxa_guard_acquire(&assignArgOccursData(Shell::FunctionDefinition::Def*)::
                                   termArgStack), iVar2 != 0)) {
    assignArgOccursData::termArgStack._capacity = 4;
    assignArgOccursData::termArgStack._stack =
         (Term **)Lib::FixedSizeAllocator<32UL>::alloc
                            ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48)
                            );
    assignArgOccursData::termArgStack._end =
         assignArgOccursData::termArgStack._stack + assignArgOccursData::termArgStack._capacity;
    assignArgOccursData::termArgStack._cursor = assignArgOccursData::termArgStack._stack;
    __cxa_atexit(Lib::Stack<Kernel::Term_*>::~Stack,&assignArgOccursData::termArgStack,&__dso_handle
                );
    __cxa_guard_release(&assignArgOccursData(Shell::FunctionDefinition::Def*)::termArgStack);
  }
  do {
    if (((ulong)pTVar10 & 3) == 0) {
      if ((*(uint *)&pTVar10->field_0xc & 0xfffffff) != 0) {
        if ((pTVar10->_args[0]._content & 0x20) == 0) {
          local_40 = pTVar10->_functor;
          pEVar4 = Lib::
                   DHMap<int,_Shell::FunctionDefinition::Def_*,_Lib::IdentityHash,_Lib::DefaultHash>
                   ::findEntry(&local_38->_defs,(int *)&local_40);
          if ((pEVar4 == (Entry *)0x0) || (pDVar8 = pEVar4->_val, pDVar8->mark == BLOCKED))
          goto LAB_006d8a91;
        }
        else {
LAB_006d8a91:
          pDVar8 = (Def *)0x0;
        }
        uVar7 = *(uint *)&pTVar10->field_0xc;
        if (assignArgOccursData::stack._cursor == assignArgOccursData::stack._end) {
          Lib::Stack<Kernel::TermList_*>::expand(&assignArgOccursData::stack);
        }
        *assignArgOccursData::stack._cursor = pTVar10->_args + (uVar7 & 0xfffffff);
        assignArgOccursData::stack._cursor = assignArgOccursData::stack._cursor + 1;
        if (assignArgOccursData::defArgStack._cursor == assignArgOccursData::defArgStack._end) {
          Lib::Stack<Shell::FunctionDefinition::Def_*>::expand(&assignArgOccursData::defArgStack);
        }
        *assignArgOccursData::defArgStack._cursor = pDVar8;
        assignArgOccursData::defArgStack._cursor = assignArgOccursData::defArgStack._cursor + 1;
        if (assignArgOccursData::termArgStack._cursor == assignArgOccursData::termArgStack._end) {
          Lib::Stack<Kernel::Term_*>::expand(&assignArgOccursData::termArgStack);
        }
        *assignArgOccursData::termArgStack._cursor = pTVar10;
        assignArgOccursData::termArgStack._cursor = assignArgOccursData::termArgStack._cursor + 1;
      }
    }
    else if ((int)((ulong)pTVar10 & 3) == 2) {
      assignArgOccursData::defArgStack._cursor = assignArgOccursData::defArgStack._cursor + -1;
      assignArgOccursData::termArgStack._cursor = assignArgOccursData::termArgStack._cursor + -1;
    }
    else {
      pbVar3 = updDef->argOccurs;
      local_3c = (uint)((ulong)pTVar10 >> 2);
      pEVar5 = Lib::DHMap<unsigned_int,_unsigned_int,_Lib::IdentityHash,_Lib::DefaultHash>::
               findEntry(&assignArgOccursData::var2argIndex,&local_3c);
      pbVar3[pEVar5->_val] = true;
    }
    if (assignArgOccursData::stack._cursor == assignArgOccursData::stack._stack) {
      return;
    }
    ppTVar1 = assignArgOccursData::stack._cursor + -1;
    pTVar12 = assignArgOccursData::stack._cursor[-1];
    pTVar13 = pTVar12;
    assignArgOccursData::stack._cursor = ppTVar1;
    if ((pTVar12->_content & 3) != 2) {
      if (assignArgOccursData::defArgStack._cursor[-1] == (Def *)0x0) {
        if (ppTVar1 == assignArgOccursData::stack._end) {
          Lib::Stack<Kernel::TermList_*>::expand(&assignArgOccursData::stack);
        }
        *assignArgOccursData::stack._cursor = pTVar12 + -1;
LAB_006d8c30:
        assignArgOccursData::stack._cursor = assignArgOccursData::stack._cursor + 1;
        pTVar13 = pTVar12;
      }
      else {
        uVar11 = (long)pTVar12 + (-0x28 - (long)assignArgOccursData::termArgStack._cursor[-1]);
        do {
          pTVar13 = pTVar12 + -1;
          if (assignArgOccursData::defArgStack._cursor[-1]->argOccurs
              [(*(uint *)&assignArgOccursData::termArgStack._cursor[-1]->field_0xc & 0xfffffff) -
               (int)(uVar11 >> 3)] != false) {
            if (ppTVar1 == assignArgOccursData::stack._end) {
              Lib::Stack<Kernel::TermList_*>::expand(&assignArgOccursData::stack);
            }
            *assignArgOccursData::stack._cursor = pTVar13;
            goto LAB_006d8c30;
          }
          uVar11 = uVar11 - 8;
          pTVar12 = pTVar13;
        } while ((pTVar13->_content & 3) != 2);
      }
    }
    pTVar10 = (Term *)pTVar13->_content;
  } while( true );
}

Assistant:

void FunctionDefinition::assignArgOccursData(Def* updDef)
{
  ASS(!updDef->argOccurs);

  if(!updDef->lhs->arity()) {
    return;
  }

  updDef->argOccurs=reinterpret_cast<bool*>(ALLOC_KNOWN(updDef->lhs->arity()*sizeof(bool),
	    "FunctionDefinition::Def::argOccurs"));
  std::memset(updDef->argOccurs, 0, updDef->lhs->arity() * sizeof(bool));

  static DHMap<unsigned, unsigned, IdentityHash, DefaultHash> var2argIndex;
  var2argIndex.reset();
  int argIndex=0;
  for (TermList* ts = updDef->lhs->args(); ts->isNonEmpty(); ts=ts->next()) {
    int w = ts->var();
    var2argIndex.insert(w, argIndex);
    argIndex++;
  }

  TermList t=TermList(updDef->rhs);
  static Stack<TermList*> stack(4);
  static Stack<Def*> defArgStack(4);
  static Stack<Term*> termArgStack(4);
  for(;;) {
    Def* d;
    if(t.isEmpty()) {
      defArgStack.pop();
      termArgStack.pop();
    } else if(t.isTerm()) {
      Term* trm=t.term();
      if(trm->arity()) {
        if(trm->isSort() || !_defs.find(trm->functor(), d) || d->mark==Def::BLOCKED) {
          d=0;
        }
        ASS(!d || d->mark==Def::SAFE);
        stack.push(trm->args());
        defArgStack.push(d);
        termArgStack.push(trm);
      }
    } else {
      ASS(t.isOrdinaryVar());
      updDef->argOccurs[var2argIndex.get(t.var())]=true;
    }
    if(stack.isEmpty()) {
      break;
    }
    TermList* ts=stack.pop();
    if(!ts->isEmpty()) {
      Def* argDef=defArgStack.top();
      if(argDef) {
        Term* parentTerm=termArgStack.top();
        while(ts->isNonEmpty() && !argDef->argOccurs[parentTerm->getArgumentIndex(ts)]) {
          ts=ts->next();
        }
        if(ts->isNonEmpty()) {
          stack.push(ts->next());
        }
      } else {
        stack.push(ts->next());
      }
    }
    t=*ts;
  }
}